

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O0

void __thiscall argo::lexer::append_to_number_buffer(lexer *this,char *s,size_t *index,int c)

{
  size_t sVar1;
  json_parser_exception *this_00;
  size_t byte_index;
  int c_local;
  size_t *index_local;
  char *s_local;
  lexer *this_local;
  
  if (this->m_max_token_length <= *index) {
    this_00 = (json_parser_exception *)__cxa_allocate_exception(0xe0);
    sVar1 = this->m_max_token_length;
    byte_index = reader::get_byte_index(this->m_reader);
    json_parser_exception::json_parser_exception(this_00,number_too_long_e,sVar1,byte_index);
    __cxa_throw(this_00,&json_parser_exception::typeinfo,
                json_parser_exception::~json_parser_exception);
  }
  sVar1 = *index;
  *index = sVar1 + 1;
  s[sVar1] = (char)c;
  return;
}

Assistant:

void lexer::append_to_number_buffer(char *s, size_t &index, int c)
{
    if (index >= m_max_token_length)
    {
        throw json_parser_exception(
                json_parser_exception::number_too_long_e,
                m_max_token_length,
                m_reader.get_byte_index());
    }

    s[index++] = c;
}